

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMappedVector.hpp
# Opt level: O1

BlockIterator<helics::Translator,_32,_helics::Translator_**> * __thiscall
gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>::find
          (BlockIterator<helics::Translator,_32,_helics::Translator_**> *__return_storage_ptr__,
          StringMappedVector<helics::Translator,_(reference_stability)0,_5> *this,
          string_view searchValue)

{
  long lVar1;
  uint uVar2;
  iterator iVar3;
  Translator **ppTVar4;
  int iVar5;
  Translator *pTVar6;
  key_type local_20;
  
  local_20._M_str = searchValue._M_str;
  local_20._M_len = searchValue._M_len;
  iVar3 = std::
          _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->lookup)._M_h,&local_20);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
      ._M_cur == (__node_type *)0x0) {
    StableBlockVector<helics::Translator,_5U,_std::allocator<helics::Translator>_>::end
              (__return_storage_ptr__,&this->dataStorage);
    return __return_storage_ptr__;
  }
  if ((this->dataStorage).csize == 0) {
    iVar5 = (this->dataStorage).bsize;
    ppTVar4 = (this->dataStorage).dataptr;
    if ((long)iVar5 != 0x20) {
      ppTVar4 = ppTVar4 + (this->dataStorage).dataSlotIndex;
      pTVar6 = *ppTVar4 + iVar5;
      goto LAB_002769d8;
    }
    if (ppTVar4 == (Translator **)0x0) {
      ppTVar4 = &StableBlockVector<helics::Translator,_5U,_std::allocator<helics::Translator>_>::end
                 ::emptyValue;
    }
    else {
      ppTVar4 = ppTVar4 + (long)(this->dataStorage).dataSlotIndex + 1;
    }
  }
  else {
    ppTVar4 = (this->dataStorage).dataptr;
  }
  pTVar6 = *ppTVar4;
  iVar5 = 0;
LAB_002769d8:
  lVar1 = *(long *)((long)iVar3.
                          super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
                          ._M_cur + 0x18);
  __return_storage_ptr__->vec = ppTVar4;
  __return_storage_ptr__->ptr = pTVar6 + lVar1;
  uVar2 = (int)lVar1 + iVar5;
  __return_storage_ptr__->offset = uVar2;
  if (0x1f < (int)uVar2) {
    __return_storage_ptr__->vec = ppTVar4 + (ulong)(uVar2 - 0x20 >> 5) + 1;
    __return_storage_ptr__->offset = uVar2 & 0x1f;
    __return_storage_ptr__->ptr =
         (Translator *)
         ((long)&(ppTVar4[(ulong)(uVar2 - 0x20 >> 5) + 1]->super_Interface)._vptr_Interface +
         (ulong)((uVar2 & 0x1f) * 0x50));
  }
  return __return_storage_ptr__;
}

Assistant:

auto find(std::string_view searchValue)
        {
            auto fnd = lookup.find(searchValue);
            if (fnd != lookup.end()) {
                return dataStorage.begin() + fnd->second;
            }
            return dataStorage.end();
        }